

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O3

uint64_t helper_msub64_q_ssov(CPUTriCoreState *env,uint64_t r1,uint32_t r2,uint32_t r3,uint32_t n)

{
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  int64_t t1;
  
  uVar4 = (long)(int)r3 * (long)(int)r2 << ((byte)n & 0x3f);
  uVar3 = r1 - uVar4;
  uVar1 = (uint)(uVar3 * 2 >> 0x20) ^ (uint)(uVar3 >> 0x20);
  env->PSW_USB_AV = uVar1;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar1;
  if (-1 < (long)((r1 ^ uVar4) & (uVar3 ^ r1))) {
    env->PSW_USB_V = 0;
    return uVar3;
  }
  env->PSW_USB_V = 0x80000000;
  env->PSW_USB_SV = 0x80000000;
  uVar2 = 0x8000000000000000;
  if ((long)uVar4 < 0) {
    uVar2 = 0x7fffffffffffffff;
  }
  return uVar2;
}

Assistant:

static inline int64_t sextract64(uint64_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 64 - start);
    /* Note that this implementation relies on right shift of signed
     * integers being an arithmetic shift.
     */
    return ((int64_t)(value << (64 - length - start))) >> (64 - length);
}